

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_unittest.cc
# Opt level: O0

void Test_Demangle_FromFile::RunTest(void)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  istream *piVar4;
  ulong uVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string demangled;
  string mangled;
  size_type tab_pos;
  string line;
  ifstream f;
  string test_file;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  string local_2a0 [32];
  string local_280 [32];
  long local_260;
  string local_258 [48];
  istream local_228 [520];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20;
  
  std::operator+(&local_20,(char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_228,uVar3,8);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(f.fail())");
    exit(1);
  }
  std::__cxx11::string::string(local_258);
  while( true ) {
    do {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) {
        std::__cxx11::string::~string(local_258);
        std::ifstream::~ifstream(local_228);
        std::__cxx11::string::~string((string *)&local_20);
        return;
      }
      uVar5 = std::__cxx11::string::empty();
    } while (((uVar5 & 1) != 0) ||
            (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_258), *pcVar6 == '#'));
    local_260 = std::__cxx11::string::find((char)local_258,9);
    if (local_260 == -1) break;
    std::__cxx11::string::substr((ulong)local_280,(ulong)local_258);
    std::__cxx11::string::substr((ulong)local_2a0,(ulong)local_258);
    std::__cxx11::string::c_str();
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            DemangleIt((char *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    in_stack_fffffffffffffd2f =
         std::operator==(__lhs,(char *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28)
                        );
    if (!(bool)in_stack_fffffffffffffd2f) {
      fprintf(_stderr,"Check failed: %s %s %s\n","demangled","==","DemangleIt(mangled.c_str())");
      exit(1);
    }
    std::__cxx11::string::~string(local_2a0);
    std::__cxx11::string::~string(local_280);
  }
  fprintf(_stderr,"Check failed: %s %s %s\n","string::npos","!=","tab_pos");
  exit(1);
}

Assistant:

TEST(Demangle, FromFile) {
  string test_file = FLAGS_test_srcdir + "/src/demangle_unittest.txt";
  ifstream f(test_file.c_str());  // The file should exist.
  EXPECT_FALSE(f.fail());

  string line;
  while (getline(f, line)) {
    // Lines start with '#' are considered as comments.
    if (line.empty() || line[0] == '#') {
      continue;
    }
    // Each line should contain a mangled name and a demangled name
    // separated by '\t'.  Example: "_Z3foo\tfoo"
    string::size_type tab_pos = line.find('\t');
    EXPECT_NE(string::npos, tab_pos);
    string mangled = line.substr(0, tab_pos);
    string demangled = line.substr(tab_pos + 1);
    EXPECT_EQ(demangled, DemangleIt(mangled.c_str()));
  }
}